

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

void nn_bipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  uint *puVar4;
  nn_list_item *pnVar5;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar6;
  nn_aipc *aipc;
  nn_list_item *it;
  nn_bipc *bipc;
  int rc;
  char *addr;
  nn_list_item *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  long local_48;
  nn_list_item *local_38;
  
  local_48 = in_RDI;
  if (in_RDI == 0) {
    local_48 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    if (*(long *)(local_48 + 0x2c8) == 0) {
      *(undefined4 *)(local_48 + 0x58) = 4;
    }
    else {
      nn_aipc_stop((nn_aipc *)0x167e53);
      *(undefined4 *)(local_48 + 0x58) = 3;
    }
  }
  if (*(int *)(local_48 + 0x58) == 3) {
    iVar1 = nn_aipc_isidle((nn_aipc *)0x167e9d);
    if (iVar1 == 0) {
      return;
    }
    nn_aipc_term((nn_aipc *)0x167eb8);
    nn_free((void *)0x167ec9);
    *(undefined8 *)(local_48 + 0x2c8) = 0;
    pcVar2 = nn_ep_getaddr(*(nn_ep **)(local_48 + 0x60));
    iVar1 = unlink(pcVar2);
    bVar6 = true;
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      bVar6 = *piVar3 == 2;
    }
    if (!bVar6) {
      nn_backtrace_print();
      __stream = _stderr;
      iVar1 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      __errno_location();
      pcVar2 = nn_err_strerror(iVar1);
      puVar4 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,0xb1);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_stop((nn_usock *)0x167f9e);
    *(undefined4 *)(local_48 + 0x58) = 4;
  }
  if (*(int *)(local_48 + 0x58) == 4) {
    iVar1 = nn_usock_isidle((nn_usock *)0x167fd5);
    if (iVar1 == 0) {
      return;
    }
    local_38 = nn_list_begin((nn_list *)(local_48 + 0x2d0));
    while (pnVar5 = nn_list_end((nn_list *)(local_48 + 0x2d0)), local_38 != pnVar5) {
      nn_aipc_stop((nn_aipc *)0x168054);
      local_38 = nn_list_next((nn_list *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff78);
    }
    *(undefined4 *)(local_48 + 0x58) = 5;
  }
  else {
    if (*(int *)(local_48 + 0x58) != 5) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_48 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,0xd7);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI != 2 || in_EDX != 0x85b9) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "src == NN_BIPC_SRC_AIPC && type == NN_AIPC_STOPPED",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,0xc4);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff78);
    nn_aipc_term((nn_aipc *)0x168148);
    nn_free((void *)0x168152);
  }
  iVar1 = nn_list_empty((nn_list *)(local_48 + 0x2d0));
  if (iVar1 != 0) {
    *(undefined4 *)(local_48 + 0x58) = 1;
    nn_fsm_stopped_noevent((nn_fsm *)0x16817e);
    nn_ep_stopped((nn_ep *)0x16818c);
  }
  return;
}

Assistant:

static void nn_bipc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
#if defined NN_HAVE_UNIX_SOCKETS
    const char *addr;
    int rc;
#endif

    struct nn_bipc *bipc;
    struct nn_list_item *it;
    struct nn_aipc *aipc;

    bipc = nn_cont (self, struct nn_bipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (bipc->aipc) {
            nn_aipc_stop (bipc->aipc);
            bipc->state = NN_BIPC_STATE_STOPPING_AIPC;
        }
        else {
            bipc->state = NN_BIPC_STATE_STOPPING_USOCK;
        }
    }
    if (nn_slow (bipc->state == NN_BIPC_STATE_STOPPING_AIPC)) {
        if (!nn_aipc_isidle (bipc->aipc))
            return;
        nn_aipc_term (bipc->aipc);
        nn_free (bipc->aipc);
        bipc->aipc = NULL;

        /* On *nixes, unlink the domain socket file */
#if defined NN_HAVE_UNIX_SOCKETS
        addr = nn_ep_getaddr (bipc->ep);
        rc = unlink(addr);
        errno_assert (rc == 0 || errno == ENOENT);
#endif

        nn_usock_stop (&bipc->usock);
        bipc->state = NN_BIPC_STATE_STOPPING_USOCK;
    }
    if (nn_slow (bipc->state == NN_BIPC_STATE_STOPPING_USOCK)) {
       if (!nn_usock_isidle (&bipc->usock))
            return;
        for (it = nn_list_begin (&bipc->aipcs);
              it != nn_list_end (&bipc->aipcs);
              it = nn_list_next (&bipc->aipcs, it)) {
            aipc = nn_cont (it, struct nn_aipc, item);
            nn_aipc_stop (aipc);
        }
        bipc->state = NN_BIPC_STATE_STOPPING_AIPCS;
        goto aipcs_stopping;
    }
    if (nn_slow (bipc->state == NN_BIPC_STATE_STOPPING_AIPCS)) {
        nn_assert (src == NN_BIPC_SRC_AIPC && type == NN_AIPC_STOPPED);
        aipc = (struct nn_aipc *) srcptr;
        nn_list_erase (&bipc->aipcs, &aipc->item);
        nn_aipc_term (aipc);
        nn_free (aipc);

        /*  If there are no more aipc state machines, we can stop the whole
            bipc object. */
aipcs_stopping:
        if (nn_list_empty (&bipc->aipcs)) {
            bipc->state = NN_BIPC_STATE_IDLE;
            nn_fsm_stopped_noevent (&bipc->fsm);
            nn_ep_stopped (bipc->ep);
            return;
        }

        return;
    }

    nn_fsm_bad_state(bipc->state, src, type);
}